

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O0

TrieNode<unsigned_short> * __thiscall
BurstSimple<unsigned_short>::operator()
          (BurstSimple<unsigned_short> *this,vector_bagwell<unsigned_char_*,_16U> *bucket,
          size_t depth)

{
  uint16_t uVar1;
  uint uVar2;
  TrieNode<unsigned_short> *this_00;
  size_t sVar3;
  uchar *puVar4;
  reference ppuVar5;
  reference pvVar6;
  reference ppvVar7;
  vector_bagwell<unsigned_char_*,_16U> *this_01;
  vector_bagwell<unsigned_char_*,_16U> *local_2f0;
  vector_bagwell<unsigned_char_*,_16U> *sub_bucket_1;
  uchar *puStack_2e0;
  unsigned_short ch_1;
  uchar *ptr;
  vector_bagwell<unsigned_char_*,_16U> *sub_bucket;
  uint local_2c8;
  uint uStack_2c4;
  unsigned_short ch;
  uint j_1;
  uint j;
  array<unsigned_char_*,_64UL> strings;
  array<unsigned_short,_64UL> cache;
  uint i;
  uint bucket_size;
  TrieNode<unsigned_short> *new_node;
  size_t depth_local;
  vector_bagwell<unsigned_char_*,_16U> *bucket_local;
  BurstSimple<unsigned_short> *this_local;
  
  this_00 = (TrieNode<unsigned_short> *)operator_new(0x82000);
  TrieNode<unsigned_short>::TrieNode(this_00);
  sVar3 = vector_bagwell<unsigned_char_*,_16U>::size(bucket);
  uVar2 = (uint)sVar3;
  cache._M_elems[0x3c] = 0;
  cache._M_elems[0x3d] = 0;
  for (; (uint)cache._M_elems._120_4_ < uVar2 - (uVar2 & 0x3f);
      cache._M_elems._120_4_ = cache._M_elems._120_4_ + 0x40) {
    for (uStack_2c4 = 0; uStack_2c4 < 0x40; uStack_2c4 = uStack_2c4 + 1) {
      puVar4 = vector_bagwell<unsigned_char_*,_16U>::operator[]
                         (bucket,(ulong)(cache._M_elems._120_4_ + uStack_2c4));
      ppuVar5 = std::array<unsigned_char_*,_64UL>::operator[]
                          ((array<unsigned_char_*,_64UL> *)&j_1,(ulong)uStack_2c4);
      *ppuVar5 = puVar4;
      ppuVar5 = std::array<unsigned_char_*,_64UL>::operator[]
                          ((array<unsigned_char_*,_64UL> *)&j_1,(ulong)uStack_2c4);
      uVar1 = get_char<unsigned_short>(*ppuVar5,depth);
      pvVar6 = std::array<unsigned_short,_64UL>::operator[]
                         ((array<unsigned_short,_64UL> *)((long)strings._M_elems + 0x1fc),
                          (ulong)uStack_2c4);
      *pvVar6 = uVar1;
    }
    for (local_2c8 = 0; local_2c8 < 0x40; local_2c8 = local_2c8 + 1) {
      pvVar6 = std::array<unsigned_short,_64UL>::operator[]
                         ((array<unsigned_short,_64UL> *)((long)strings._M_elems + 0x1fc),
                          (ulong)local_2c8);
      sub_bucket._6_2_ = *pvVar6;
      ppvVar7 = std::array<void_*,_65536UL>::operator[]
                          ((array<void_*,_65536UL> *)this_00,(ulong)sub_bucket._6_2_);
      ptr = (uchar *)*ppvVar7;
      if (ptr == (uchar *)0x0) {
        this_01 = (vector_bagwell<unsigned_char_*,_16U> *)operator_new(0x28);
        vector_bagwell<unsigned_char_*,_16U>::vector_bagwell(this_01);
        ptr = (uchar *)this_01;
        ppvVar7 = std::array<void_*,_65536UL>::operator[]
                            ((array<void_*,_65536UL> *)this_00,(ulong)sub_bucket._6_2_);
        *ppvVar7 = this_01;
      }
      puVar4 = ptr;
      ppuVar5 = std::array<unsigned_char_*,_64UL>::operator[]
                          ((array<unsigned_char_*,_64UL> *)&j_1,(ulong)local_2c8);
      vector_bagwell<unsigned_char_*,_16U>::push_back
                ((vector_bagwell<unsigned_char_*,_16U> *)puVar4,ppuVar5);
    }
  }
  for (; (uint)cache._M_elems._120_4_ < uVar2; cache._M_elems._120_4_ = cache._M_elems._120_4_ + 1)
  {
    puStack_2e0 = vector_bagwell<unsigned_char_*,_16U>::operator[]
                            (bucket,(ulong)(uint)cache._M_elems._120_4_);
    uVar1 = get_char<unsigned_short>(puStack_2e0,depth);
    ppvVar7 = std::array<void_*,_65536UL>::operator[]
                        ((array<void_*,_65536UL> *)this_00,(ulong)uVar1);
    local_2f0 = (vector_bagwell<unsigned_char_*,_16U> *)*ppvVar7;
    if (local_2f0 == (vector_bagwell<unsigned_char_*,_16U> *)0x0) {
      local_2f0 = (vector_bagwell<unsigned_char_*,_16U> *)operator_new(0x28);
      vector_bagwell<unsigned_char_*,_16U>::vector_bagwell(local_2f0);
      ppvVar7 = std::array<void_*,_65536UL>::operator[]
                          ((array<void_*,_65536UL> *)this_00,(ulong)uVar1);
      *ppvVar7 = local_2f0;
    }
    vector_bagwell<unsigned_char_*,_16U>::push_back(local_2f0,&stack0xfffffffffffffd20);
  }
  return this_00;
}

Assistant:

TrieNode<CharT>*
	operator()(const BucketT& bucket, size_t depth) const
	{
		TrieNode<CharT>* new_node = new TrieNode<CharT>;
		const unsigned bucket_size = bucket.size();
		// Use a small cache to reduce memory stalls. Also cache the
		// string pointers, in case the indexing operation of the
		// container is expensive.
		unsigned i=0;
		for (; i < bucket_size-bucket_size%64; i+=64) {
			array<CharT, 64> cache;
			array<unsigned char*, 64> strings;
			for (unsigned j=0; j < 64; ++j) {
				strings[j] = bucket[i+j];
				cache[j] = get_char<CharT>(strings[j], depth);
			}
			for (unsigned j=0; j < 64; ++j) {
				const CharT ch = cache[j];
				BucketT* sub_bucket = static_cast<BucketT*>(
					new_node->buckets[ch]);
				if (not sub_bucket) {
					new_node->buckets[ch] = sub_bucket
						= new BucketT;
				}
				sub_bucket->push_back(strings[j]);
			}
		}
		for (; i < bucket_size; ++i) {
			unsigned char* ptr = bucket[i];
			const CharT ch = get_char<CharT>(ptr, depth);
			BucketT* sub_bucket = static_cast<BucketT*>(
				new_node->buckets[ch]);
			if (not sub_bucket) {
				new_node->buckets[ch] = sub_bucket
					= new BucketT;
			}
			sub_bucket->push_back(ptr);
		}
		return new_node;
	}